

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::NormalGetFullPath
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,bool implib,
          bool realname)

{
  bool bVar1;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  undefined1 local_23;
  byte local_22;
  byte local_21;
  bool realname_local;
  string *psStack_20;
  bool implib_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  string *fpath;
  
  local_23 = 0;
  local_22 = realname;
  local_21 = implib;
  psStack_20 = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  GetDirectory(__return_storage_ptr__,this,config,implib);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  bVar1 = IsAppBundleOnApple(this);
  if (bVar1) {
    BuildMacContentDirectory(&local_58,this,__return_storage_ptr__,psStack_20,false);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
  }
  if ((local_21 & 1) == 0) {
    if ((local_22 & 1) == 0) {
      GetFullName(&local_b8,this,psStack_20,false);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    else {
      NormalGetRealName(&local_98,this,psStack_20);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
  }
  else {
    GetFullName(&local_78,this,psStack_20,true);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::NormalGetFullPath(const std::string& config,
                                                 bool implib,
                                                 bool realname) const
{
  std::string fpath = this->GetDirectory(config, implib);
  fpath += "/";
  if(this->IsAppBundleOnApple())
    {
    fpath = this->BuildMacContentDirectory(fpath, config, false);
    fpath += "/";
    }

  // Add the full name of the target.
  if(implib)
    {
    fpath += this->GetFullName(config, true);
    }
  else if(realname)
    {
    fpath += this->NormalGetRealName(config);
    }
  else
    {
    fpath += this->GetFullName(config, false);
    }
  return fpath;
}